

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  long lVar1;
  wchar_t wVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  long lVar14;
  htree_t *phVar15;
  byte bVar16;
  ulong uVar17;
  uint16_t *puVar18;
  htree_t *phVar19;
  uint uVar20;
  ushort uVar21;
  uint uVar22;
  uint16_t uVar23;
  long lVar24;
  wchar_t wVar25;
  wchar_t wVar26;
  wchar_t wVar27;
  ulong uVar28;
  uint16_t *puVar29;
  int iVar31;
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar49;
  int iVar51;
  undefined1 auVar50 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar54 [16];
  wchar_t bitptn [17];
  wchar_t weight [17];
  uint auStack_c8 [20];
  uint auStack_78 [18];
  
  uVar13 = 0x8000;
  uVar17 = 0;
  uVar28 = 0;
  uVar20 = 0;
  do {
    auStack_c8[uVar17 + 1] = uVar20;
    auStack_78[uVar17 + 1] = uVar13;
    lVar14 = uVar17 + 1;
    uVar20 = hf->freq[lVar14] * uVar13 + uVar20;
    uVar17 = uVar17 + 1;
    if (hf->freq[lVar14] != L'\0') {
      uVar28 = uVar17 & 0xffffffff;
    }
    uVar13 = uVar13 >> 1;
  } while (uVar17 != 0x10);
  if (uVar20 != 0x10000) {
    return L'\0';
  }
  wVar27 = (wchar_t)uVar28;
  if (hf->tbl_bits < wVar27) {
    return L'\0';
  }
  hf->max_bits = wVar27;
  if (wVar27 < L'\x10') {
    if (L'\0' < wVar27) {
      bVar16 = 0x10 - (char)uVar28;
      uVar17 = 1;
      do {
        auStack_c8[uVar17] = (int)auStack_c8[uVar17] >> (bVar16 & 0x1f);
        auStack_78[uVar17] = (int)auStack_78[uVar17] >> (bVar16 & 0x1f);
        uVar17 = uVar17 + 1;
      } while ((uint)(wVar27 + L'\x01') != uVar17);
      if (L'\n' < wVar27) goto LAB_00129650;
    }
    puVar29 = hf->tbl;
    wVar27 = L'\0';
  }
  else {
LAB_00129650:
    wVar27 = wVar27 + L'\xfffffff6';
    lVar14 = 1;
    do {
      auStack_c8[lVar14] = (int)auStack_c8[lVar14] >> ((byte)wVar27 & 0x1f);
      auStack_78[lVar14] = (int)auStack_78[lVar14] >> ((byte)wVar27 & 0x1f);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xb);
    lVar14 = (long)hf->freq[10] * (long)(int)auStack_78[10] + (long)(int)auStack_c8[10];
    puVar29 = hf->tbl;
    if ((int)lVar14 < 0x400) {
      memset(puVar29 + lVar14,0,lVar14 * -2 + 0x800);
    }
  }
  hf->shift_bits = wVar27;
  puVar3 = hf->bitlen;
  wVar2 = hf->len_avail;
  lVar14 = (long)wVar2;
  hf->tree_used = L'\0';
  auVar12 = _DAT_00163810;
  auVar11 = _DAT_00163800;
  auVar10 = _DAT_001637f0;
  auVar9 = _DAT_001637c0;
  auVar8 = _DAT_001637b0;
  if (0 < lVar14) {
    uVar13 = 1 << ((byte)wVar27 - 1 & 0x1f);
    wVar25 = L'\0';
    lVar24 = 0;
    do {
      bVar16 = puVar3[lVar24];
      if (bVar16 != 0) {
        uVar17 = (ulong)((uint)bVar16 * 4);
        uVar20 = *(uint *)((long)auStack_c8 + uVar17);
        uVar22 = *(uint *)((long)auStack_78 + uVar17);
        *(uint *)((long)auStack_c8 + uVar17) = uVar22 + uVar20;
        uVar23 = (uint16_t)lVar24;
        if (bVar16 < 0xb) {
          if (0x400 < (int)(uVar22 + uVar20)) {
            return L'\0';
          }
          if (0 < (int)uVar22) {
            lVar1 = (ulong)uVar22 - 1;
            auVar30._8_4_ = (int)lVar1;
            auVar30._0_8_ = lVar1;
            auVar30._12_4_ = (int)((ulong)lVar1 >> 0x20);
            puVar18 = puVar29 + (long)(int)uVar20 + ((ulong)uVar22 - 1);
            auVar30 = auVar30 ^ auVar9;
            uVar17 = 0;
            do {
              auVar42._8_4_ = (int)uVar17;
              auVar42._0_8_ = uVar17;
              auVar42._12_4_ = (int)(uVar17 >> 0x20);
              auVar34 = (auVar42 | auVar8) ^ auVar9;
              iVar43 = auVar30._0_4_;
              iVar49 = -(uint)(iVar43 < auVar34._0_4_);
              iVar31 = auVar30._4_4_;
              auVar35._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
              iVar48 = auVar30._8_4_;
              iVar51 = -(uint)(iVar48 < auVar34._8_4_);
              iVar32 = auVar30._12_4_;
              auVar35._12_4_ = -(uint)(iVar32 < auVar34._12_4_);
              auVar45._4_4_ = iVar49;
              auVar45._0_4_ = iVar49;
              auVar45._8_4_ = iVar51;
              auVar45._12_4_ = iVar51;
              auVar52 = pshuflw(in_XMM11,auVar45,0xe8);
              auVar37._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
              auVar37._12_4_ = -(uint)(auVar34._12_4_ == iVar32);
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar54 = pshuflw(in_XMM12,auVar37,0xe8);
              auVar35._0_4_ = auVar35._4_4_;
              auVar35._8_4_ = auVar35._12_4_;
              auVar53 = pshuflw(auVar52,auVar35,0xe8);
              auVar34._8_4_ = 0xffffffff;
              auVar34._0_8_ = 0xffffffffffffffff;
              auVar34._12_4_ = 0xffffffff;
              auVar34 = (auVar53 | auVar54 & auVar52) ^ auVar34;
              auVar34 = packssdw(auVar34,auVar34);
              if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar18 = uVar23;
              }
              auVar35 = auVar37 & auVar45 | auVar35;
              auVar34 = packssdw(auVar35,auVar35);
              auVar53._8_4_ = 0xffffffff;
              auVar53._0_8_ = 0xffffffffffffffff;
              auVar53._12_4_ = 0xffffffff;
              auVar34 = packssdw(auVar34 ^ auVar53,auVar34 ^ auVar53);
              if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
                puVar18[-1] = uVar23;
              }
              auVar34 = (auVar42 | auVar12) ^ auVar9;
              iVar49 = -(uint)(iVar43 < auVar34._0_4_);
              auVar50._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
              iVar51 = -(uint)(iVar48 < auVar34._8_4_);
              auVar50._12_4_ = -(uint)(iVar32 < auVar34._12_4_);
              auVar36._4_4_ = iVar49;
              auVar36._0_4_ = iVar49;
              auVar36._8_4_ = iVar51;
              auVar36._12_4_ = iVar51;
              auVar44._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
              auVar44._12_4_ = -(uint)(auVar34._12_4_ == iVar32);
              auVar44._0_4_ = auVar44._4_4_;
              auVar44._8_4_ = auVar44._12_4_;
              auVar50._0_4_ = auVar50._4_4_;
              auVar50._8_4_ = auVar50._12_4_;
              auVar34 = auVar44 & auVar36 | auVar50;
              auVar34 = packssdw(auVar34,auVar34);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar34 = packssdw(auVar34 ^ auVar4,auVar34 ^ auVar4);
              if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar18[-2] = uVar23;
              }
              auVar37 = pshufhw(auVar36,auVar36,0x84);
              auVar45 = pshufhw(auVar44,auVar44,0x84);
              auVar35 = pshufhw(auVar37,auVar50,0x84);
              auVar38._8_4_ = 0xffffffff;
              auVar38._0_8_ = 0xffffffffffffffff;
              auVar38._12_4_ = 0xffffffff;
              auVar38 = (auVar35 | auVar45 & auVar37) ^ auVar38;
              auVar37 = packssdw(auVar38,auVar38);
              if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar18[-3] = uVar23;
              }
              auVar37 = (auVar42 | auVar11) ^ auVar9;
              iVar49 = -(uint)(iVar43 < auVar37._0_4_);
              auVar40._4_4_ = -(uint)(iVar31 < auVar37._4_4_);
              iVar51 = -(uint)(iVar48 < auVar37._8_4_);
              auVar40._12_4_ = -(uint)(iVar32 < auVar37._12_4_);
              auVar46._4_4_ = iVar49;
              auVar46._0_4_ = iVar49;
              auVar46._8_4_ = iVar51;
              auVar46._12_4_ = iVar51;
              auVar34 = pshuflw(auVar34,auVar46,0xe8);
              auVar39._4_4_ = -(uint)(auVar37._4_4_ == iVar31);
              auVar39._12_4_ = -(uint)(auVar37._12_4_ == iVar32);
              auVar39._0_4_ = auVar39._4_4_;
              auVar39._8_4_ = auVar39._12_4_;
              auVar37 = pshuflw(auVar54 & auVar52,auVar39,0xe8);
              in_XMM12 = auVar37 & auVar34;
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar34 = pshuflw(auVar34,auVar40,0xe8);
              auVar52._8_4_ = 0xffffffff;
              auVar52._0_8_ = 0xffffffffffffffff;
              auVar52._12_4_ = 0xffffffff;
              auVar52 = (auVar34 | in_XMM12) ^ auVar52;
              in_XMM11 = packssdw(auVar52,auVar52);
              if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar18[-4] = uVar23;
              }
              auVar40 = auVar39 & auVar46 | auVar40;
              auVar34 = packssdw(auVar40,auVar40);
              auVar54._8_4_ = 0xffffffff;
              auVar54._0_8_ = 0xffffffffffffffff;
              auVar54._12_4_ = 0xffffffff;
              auVar34 = packssdw(auVar34 ^ auVar54,auVar34 ^ auVar54);
              if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar18[-5] = uVar23;
              }
              auVar34 = (auVar42 | auVar10) ^ auVar9;
              iVar43 = -(uint)(iVar43 < auVar34._0_4_);
              auVar47._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
              iVar48 = -(uint)(iVar48 < auVar34._8_4_);
              auVar47._12_4_ = -(uint)(iVar32 < auVar34._12_4_);
              auVar41._4_4_ = iVar43;
              auVar41._0_4_ = iVar43;
              auVar41._8_4_ = iVar48;
              auVar41._12_4_ = iVar48;
              auVar33._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
              auVar33._12_4_ = -(uint)(auVar34._12_4_ == iVar32);
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              auVar47._0_4_ = auVar47._4_4_;
              auVar47._8_4_ = auVar47._12_4_;
              auVar34 = auVar33 & auVar41 | auVar47;
              auVar34 = packssdw(auVar34,auVar34);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
              if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar18[-6] = uVar23;
              }
              auVar42 = pshufhw(auVar41,auVar41,0x84);
              auVar34 = pshufhw(auVar33,auVar33,0x84);
              auVar37 = pshufhw(auVar42,auVar47,0x84);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar34 = packssdw(auVar34 & auVar42,(auVar37 | auVar34 & auVar42) ^ auVar6);
              if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar18[-7] = uVar23;
              }
              uVar17 = uVar17 + 8;
              puVar18 = puVar18 + -8;
            } while ((uVar22 + 7 & 0xfffffff8) != uVar17);
          }
        }
        else {
          iVar43 = (int)uVar20 >> ((byte)wVar27 & 0x1f);
          sVar7 = (short)wVar2;
          if (puVar29[iVar43] == 0) {
            puVar29[iVar43] = (short)wVar25 + sVar7;
            phVar15 = hf->tree;
            wVar26 = wVar25 + L'\x01';
            hf->tree_used = wVar26;
            if (hf->tree_avail <= wVar25) {
              return L'\0';
            }
            phVar19 = phVar15 + wVar25;
            phVar19->left = 0;
            phVar19->right = 0;
          }
          else {
            wVar26 = (wchar_t)puVar29[iVar43];
            if (wVar26 < wVar2) {
              return L'\0';
            }
            if (wVar25 + wVar2 <= wVar26) {
              return L'\0';
            }
            phVar15 = hf->tree;
            phVar19 = phVar15 + (wVar26 - wVar2);
            wVar26 = wVar25;
          }
          uVar21 = (ushort)uVar13;
          if (bVar16 != 0xb) {
            iVar43 = bVar16 - 10;
            uVar22 = uVar13;
            do {
              if ((uVar22 & 0xffff & uVar20) == 0) {
                uVar21 = phVar19->right;
                if ((int)(uint)uVar21 < wVar2) {
                  phVar19->right = sVar7 + (short)wVar26;
                  goto LAB_00129a7c;
                }
LAB_00129a99:
                phVar19 = phVar15 + ((ulong)uVar21 - lVar14);
              }
              else {
                uVar21 = phVar19->left;
                if (wVar2 <= (int)(uint)uVar21) goto LAB_00129a99;
                phVar19->left = sVar7 + (short)wVar26;
LAB_00129a7c:
                hf->tree_used = wVar26 + L'\x01';
                if (hf->tree_avail <= wVar26) {
                  return L'\0';
                }
                phVar19 = phVar15 + wVar26;
                phVar19->left = 0;
                phVar19->right = 0;
                wVar26 = wVar26 + L'\x01';
              }
              uVar22 = (uVar22 & 0xffff) >> 1;
              iVar43 = iVar43 + -1;
              uVar21 = (ushort)uVar22;
            } while (1 < iVar43);
          }
          if (((ushort)uVar20 & uVar21) == 0) {
            if (phVar19->right != 0) {
              return L'\0';
            }
            phVar19 = (htree_t *)&phVar19->right;
          }
          else if (phVar19->left != 0) {
            return L'\0';
          }
          phVar19->left = uVar23;
          wVar25 = wVar26;
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar14);
  }
  return L'\x01';
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		int htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			while (--cnt >= 0)
				p[cnt] = (uint16_t)i;
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}